

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

iteration_time __thiscall
helics::FederateState::requestTime
          (FederateState *this,Time nextTime,IterationRequest iterate,bool sendRequest)

{
  nanoseconds time;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view logMessageSource_01;
  string_view logMessageSource_02;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  FederateStates FVar4;
  int32_t iVar5;
  pointer pTVar6;
  time_type expirationTime;
  byte in_CL;
  undefined1 in_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  undefined8 extraout_RDX_03;
  baseType in_RSI;
  FederateState *in_RDI;
  iteration_time iVar8;
  iteration_time iVar9;
  IterationResult ret;
  lock_guard<helics::FederateState> fedlock;
  type current_lead_1;
  type timegap_1;
  time_point current_clock_time_1;
  MessageProcessingResult ret_1;
  ActionMessage grantCheck;
  ActionMessage tforce_1;
  ActionMessage tforce;
  type current_lead;
  type timegap;
  time_point current_clock_time;
  ActionMessage treq;
  Time lastTime;
  iteration_time retTime;
  undefined4 in_stack_fffffffffffff648;
  undefined4 uVar10;
  int32_t in_stack_fffffffffffff64c;
  undefined4 in_stack_fffffffffffff650;
  undefined2 in_stack_fffffffffffff654;
  undefined1 in_stack_fffffffffffff656;
  undefined1 in_stack_fffffffffffff657;
  IterationResult IVar11;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffff658;
  nanoseconds in_stack_fffffffffffff660;
  TimeRepresentation<count_time<9,_long>_> *this_00;
  undefined4 in_stack_fffffffffffff668;
  action_t in_stack_fffffffffffff66c;
  ActionMessage *in_stack_fffffffffffff670;
  Time *__rhs;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffff678;
  Time *pTVar12;
  ActionMessage *in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  int32_t in_stack_fffffffffffff694;
  MessageTimer *in_stack_fffffffffffff698;
  time_type in_stack_fffffffffffff6a0;
  undefined2 uVar13;
  undefined4 in_stack_fffffffffffff6a8;
  int32_t in_stack_fffffffffffff6ac;
  Time in_stack_fffffffffffff6b0;
  ActionMessage *mess;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff6fc;
  bool local_8e1;
  undefined7 in_stack_fffffffffffff738;
  undefined1 in_stack_fffffffffffff73f;
  undefined4 in_stack_fffffffffffff740;
  int32_t in_stack_fffffffffffff744;
  MessageTimer *in_stack_fffffffffffff748;
  nanoseconds in_stack_fffffffffffff750;
  double local_880;
  double local_878;
  char *local_870;
  undefined8 local_868;
  undefined1 local_860 [32];
  __sv_type local_840;
  __sv_type local_830;
  TimeRepresentation<count_time<9,_long>_> local_820;
  __unspec local_815;
  int local_814;
  duration<long,std::ratio<1l,1000l>> local_810 [3];
  undefined1 in_stack_fffffffffffff7f3;
  int in_stack_fffffffffffff7f4;
  undefined7 in_stack_fffffffffffff7f8;
  strong_ordering in_stack_fffffffffffff7ff;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffff800;
  nanoseconds in_stack_fffffffffffff808;
  type in_stack_fffffffffffff810;
  type in_stack_fffffffffffff818;
  TimeRepresentation<count_time<9,_long>_> local_7d8;
  rep local_7d0;
  undefined8 local_7c8;
  TimeRepresentation<count_time<9,_long>_> local_7c0;
  baseType local_7b8;
  IterationResult local_7a9;
  format_args in_stack_fffffffffffff8b0;
  string_view in_stack_fffffffffffff8c0;
  undefined1 local_6e0 [184];
  rep local_628;
  undefined2 local_600;
  BaseType local_55c;
  BaseType local_550;
  baseType local_538;
  duration local_3e8;
  ActionMessage local_3e0;
  duration local_328;
  BaseType local_31c;
  BaseType local_310;
  baseType local_2f8;
  __unspec local_25d;
  int local_25c;
  duration<long,std::ratio<1l,1000l>> local_258 [15];
  type local_249;
  baseType local_248;
  rep local_240;
  rep local_238;
  rep local_230;
  undefined8 local_228;
  TimeRepresentation<count_time<9,_long>_> local_220;
  undefined1 local_218 [32];
  __sv_type local_1f8;
  __sv_type local_1e8;
  BaseType local_1d4;
  ActionMessage local_1d0;
  __sv_type local_e8;
  __sv_type local_d8;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  Time nextTime_00;
  TimeRepresentation<count_time<9,_long>_> local_b0;
  TimeRepresentation<count_time<9,_long>_> local_a8;
  IterationResult local_a0;
  double local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  double *local_70;
  char *local_68;
  undefined8 uStack_60;
  double *local_58;
  double *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  double local_20;
  double *local_18;
  double *local_10;
  undefined8 *local_8;
  
  uVar13 = (undefined2)((ulong)in_stack_ffffffffffffff38.internalTimeCode >> 0x30);
  bVar1 = in_CL & 1;
  nextTime_00.internalTimeCode = (baseType)in_RDI;
  local_b0.internalTimeCode = in_RSI;
  bVar2 = try_lock(in_RDI);
  if (bVar2) {
    pTVar6 = std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x4e82ca);
    TimeCoordinator::getGrantedTime(pTVar6);
    std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::clear
              ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x4e82ee
              );
    if (0x17 < in_RDI->maxLogLevel) {
      local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff657,
                                     CONCAT16(in_stack_fffffffffffff656,
                                              CONCAT24(in_stack_fffffffffffff654,
                                                       in_stack_fffffffffffff650))));
      pTVar6 = std::
               unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
               operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           *)0x4e8330);
      (*(pTVar6->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[0xb])();
      local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff657,
                                     CONCAT16(in_stack_fffffffffffff656,
                                              CONCAT24(in_stack_fffffffffffff654,
                                                       in_stack_fffffffffffff650))));
      in_stack_fffffffffffff648 = 0;
      logMessageSource._M_str = (char *)in_stack_fffffffffffff818.__r;
      logMessageSource._M_len = in_stack_fffffffffffff810.__r;
      message._M_str = (char *)in_stack_fffffffffffff808.__r;
      message._M_len = in_stack_fffffffffffff800.internalTimeCode;
      logMessage((FederateState *)
                 CONCAT17(in_stack_fffffffffffff7ff._M_value,in_stack_fffffffffffff7f8),
                 in_stack_fffffffffffff7f4,logMessageSource,message,(bool)in_stack_fffffffffffff7f3)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff657,
                          CONCAT16(in_stack_fffffffffffff656,
                                   CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))));
    }
    if ((bVar1 & 1) != 0) {
      ActionMessage::ActionMessage(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
      local_1d4 = (BaseType)std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
      local_1d0.actionTime.internalTimeCode = local_b0.internalTimeCode;
      local_1d0.source_id = (GlobalFederateId)local_1d4;
      setIterationFlags((ActionMessage *)
                        CONCAT17(in_stack_fffffffffffff657,
                                 CONCAT16(in_stack_fffffffffffff656,
                                          CONCAT24(in_stack_fffffffffffff654,
                                                   in_stack_fffffffffffff650))),
                        (IterationRequest)((uint)in_stack_fffffffffffff64c >> 0x18));
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>(&local_1d0,indicator_flag);
      addAction((FederateState *)
                CONCAT17(in_stack_fffffffffffff657,
                         CONCAT16(in_stack_fffffffffffff656,
                                  CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))),
                (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      if (0x17 < in_RDI->maxLogLevel) {
        local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff657,
                                        CONCAT16(in_stack_fffffffffffff656,
                                                 CONCAT24(in_stack_fffffffffffff654,
                                                          in_stack_fffffffffffff650))));
        pTVar6 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x4e84c6);
        (*(pTVar6->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[0xb])(local_218);
        local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff657,
                                        CONCAT16(in_stack_fffffffffffff656,
                                                 CONCAT24(in_stack_fffffffffffff654,
                                                          in_stack_fffffffffffff650))));
        in_stack_fffffffffffff648 = 0;
        logMessageSource_00._M_str = (char *)in_stack_fffffffffffff818.__r;
        logMessageSource_00._M_len = in_stack_fffffffffffff810.__r;
        message_00._M_str = (char *)in_stack_fffffffffffff808.__r;
        message_00._M_len = in_stack_fffffffffffff800.internalTimeCode;
        logMessage((FederateState *)
                   CONCAT17(in_stack_fffffffffffff7ff._M_value,in_stack_fffffffffffff7f8),
                   in_stack_fffffffffffff7f4,logMessageSource_00,message_00,
                   (bool)in_stack_fffffffffffff7f3);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff657,
                            CONCAT16(in_stack_fffffffffffff656,
                                     CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)))
                  );
      }
      ActionMessage::~ActionMessage
                ((ActionMessage *)
                 CONCAT17(in_stack_fffffffffffff657,
                          CONCAT16(in_stack_fffffffffffff656,
                                   CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))));
    }
    local_8e1 = false;
    if ((in_RDI->realtime & 1U) != 0) {
      pTVar12 = &in_RDI->rt_lag;
      local_220 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      local_8e1 = TimeRepresentation<count_time<9,_long>_>::operator<(pTVar12,&local_220);
    }
    if (local_8e1 == false) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&in_RDI->grantTimeOutPeriod,
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      uVar13 = (undefined2)((ulong)in_stack_fffffffffffff6a0.__d.__r >> 0x30);
      if (bVar2) {
        ActionMessage::ActionMessage(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
        ActionMessage::setExtraData
                  ((ActionMessage *)
                   CONCAT17(in_stack_fffffffffffff657,
                            CONCAT16(in_stack_fffffffffffff656,
                                     CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)))
                   ,in_stack_fffffffffffff64c);
        local_600 = 0;
        if (in_RDI->grantTimeoutTimeIndex < 0) {
          in_stack_fffffffffffff6b0.internalTimeCode =
               (baseType)
               std::
               __shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4e8a75);
          local_628 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ms
                                     ((TimeRepresentation<count_time<9,_long>_> *)
                                      CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
          ;
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff660.__r,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff658);
          uVar13 = (undefined2)((ulong)local_6e0 >> 0x30);
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
          ;
          time.__r._4_4_ = in_stack_fffffffffffff744;
          time.__r._0_4_ = in_stack_fffffffffffff740;
          in_stack_fffffffffffff6ac =
               MessageTimer::addTimerFromNow
                         ((MessageTimer *)
                          CONCAT17(in_stack_fffffffffffff73f,in_stack_fffffffffffff738),time,
                          (ActionMessage *)in_RDI);
          in_RDI->grantTimeoutTimeIndex = in_stack_fffffffffffff6ac;
          ActionMessage::~ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )));
        }
        else {
          std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4e8b67);
          in_stack_fffffffffffff694 = in_RDI->realTimeTimerIndex;
          TimeRepresentation<count_time<9,_long>_>::to_ms
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
          std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1000l>,void>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff660.__r,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff658);
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
          ;
          MessageTimer::updateTimerFromNow
                    (in_stack_fffffffffffff748,in_stack_fffffffffffff744,in_stack_fffffffffffff750,
                     (ActionMessage *)CONCAT17(in_stack_fffffffffffff73f,in_stack_fffffffffffff738))
          ;
          ActionMessage::~ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )));
        }
        ActionMessage::~ActionMessage
                  ((ActionMessage *)
                   CONCAT17(in_stack_fffffffffffff657,
                            CONCAT16(in_stack_fffffffffffff656,
                                     CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)))
                  );
      }
    }
    else {
      local_228 = std::chrono::_V2::steady_clock::now();
      local_230 = (rep)std::chrono::operator-
                                 (in_stack_fffffffffffff658,
                                  (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff657,
                                              CONCAT16(in_stack_fffffffffffff656,
                                                       CONCAT24(in_stack_fffffffffffff654,
                                                                in_stack_fffffffffffff650))));
      local_248 = (baseType)
                  TimeRepresentation<count_time<9,_long>_>::operator+
                            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff658,
                             (TimeRepresentation<count_time<9,_long>_> *)
                             CONCAT17(in_stack_fffffffffffff657,
                                      CONCAT16(in_stack_fffffffffffff656,
                                               CONCAT24(in_stack_fffffffffffff654,
                                                        in_stack_fffffffffffff650))));
      local_240 = (rep)TimeRepresentation<count_time<9,_long>_>::to_ns
                                 ((TimeRepresentation<count_time<9,_long>_> *)
                                  CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
      local_238 = (rep)std::chrono::operator-
                                 ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                  CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                                  in_stack_fffffffffffff660.__r);
      local_25c = 0;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_258,&local_25c);
      local_249 = (type)std::chrono::
                        operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                  (in_stack_fffffffffffff678,
                                   (duration<long,_std::ratio<1L,_1000L>_> *)
                                   in_stack_fffffffffffff670);
      CLI::std::__cmp_cat::__unspec::__unspec(&local_25d,(__unspec *)0x0);
      bVar2 = std::operator>(local_249);
      if (bVar2) {
        ActionMessage::ActionMessage(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
        local_31c = (BaseType)
                    std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
        local_2f8 = local_b0.internalTimeCode;
        local_310 = local_31c;
        if (in_RDI->realTimeTimerIndex < 0) {
          expirationTime.__d.__r =
               (duration)
               std::
               __shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4e876b);
          uVar13 = (undefined2)((ulong)in_stack_fffffffffffff6a0.__d.__r >> 0x30);
          local_328.__r =
               (rep)std::chrono::operator+
                              (in_stack_fffffffffffff658,
                               (duration<long,_std::ratio<1L,_1000000000L>_> *)
                               CONCAT17(in_stack_fffffffffffff657,
                                        CONCAT16(in_stack_fffffffffffff656,
                                                 CONCAT24(in_stack_fffffffffffff654,
                                                          in_stack_fffffffffffff650))));
          mess = &local_3e0;
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
          ;
          iVar5 = MessageTimer::addTimer
                            ((MessageTimer *)
                             CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                             expirationTime,mess);
          in_RDI->realTimeTimerIndex = iVar5;
          ActionMessage::~ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )));
        }
        else {
          std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x4e885f);
          local_3e8.__r =
               (rep)std::chrono::operator+
                              (in_stack_fffffffffffff658,
                               (duration<long,_std::ratio<1L,_1000000000L>_> *)
                               CONCAT17(in_stack_fffffffffffff657,
                                        CONCAT16(in_stack_fffffffffffff656,
                                                 CONCAT24(in_stack_fffffffffffff654,
                                                          in_stack_fffffffffffff650))));
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )),
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648))
          ;
          MessageTimer::updateTimer
                    (in_stack_fffffffffffff698,in_stack_fffffffffffff694,in_stack_fffffffffffff6a0,
                     in_stack_fffffffffffff688);
          uVar13 = (undefined2)((ulong)in_stack_fffffffffffff6a0.__d.__r >> 0x30);
          ActionMessage::~ActionMessage
                    ((ActionMessage *)
                     CONCAT17(in_stack_fffffffffffff657,
                              CONCAT16(in_stack_fffffffffffff656,
                                       CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)
                                      )));
        }
        ActionMessage::~ActionMessage
                  ((ActionMessage *)
                   CONCAT17(in_stack_fffffffffffff657,
                            CONCAT16(in_stack_fffffffffffff656,
                                     CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)))
                  );
      }
      else {
        ActionMessage::ActionMessage(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
        uVar13 = (undefined2)((ulong)in_stack_fffffffffffff6a0.__d.__r >> 0x30);
        local_55c = (BaseType)
                    std::atomic<helics::GlobalFederateId>::load(&in_RDI->global_id,seq_cst);
        local_538 = local_b0.internalTimeCode;
        local_550 = local_55c;
        addAction((FederateState *)
                  CONCAT17(in_stack_fffffffffffff657,
                           CONCAT16(in_stack_fffffffffffff656,
                                    CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))),
                  (ActionMessage *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
        ActionMessage::~ActionMessage
                  ((ActionMessage *)
                   CONCAT17(in_stack_fffffffffffff657,
                            CONCAT16(in_stack_fffffffffffff656,
                                     CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650)))
                  );
      }
    }
    local_7a9 = processQueue((FederateState *)
                             CONCAT17(in_stack_fffffffffffff7ff._M_value,in_stack_fffffffffffff7f8))
    ;
    local_7b8 = local_b0.internalTimeCode;
    updateDataForTimeReturn
              ((FederateState *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
               (MessageProcessingResult)((ushort)uVar13 >> 8),in_stack_fffffffffffff6b0,
               (IterationRequest)uVar13);
    local_a8.internalTimeCode = (in_RDI->time_granted).internalTimeCode;
    local_a0 = local_7a9;
    if ((in_RDI->realtime & 1U) == 0) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&in_RDI->grantTimeOutPeriod,
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar2) {
        std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4e8ed8);
        MessageTimer::cancelTimer
                  ((MessageTimer *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
      }
    }
    else {
      pTVar12 = &in_RDI->rt_lag;
      local_7c0 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<(pTVar12,&local_7c0);
      if (bVar2) {
        std::__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4e8d09);
        MessageTimer::cancelTimer
                  ((MessageTimer *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
      }
      if (local_7a9 == NEXT_STEP) {
        local_7c8 = std::chrono::_V2::steady_clock::now();
        in_stack_fffffffffffff818 =
             std::chrono::operator-
                       (in_stack_fffffffffffff658,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)CONCAT17(in_stack_fffffffffffff657,
                                    CONCAT16(in_stack_fffffffffffff656,
                                             CONCAT24(in_stack_fffffffffffff654,
                                                      in_stack_fffffffffffff650))));
        __rhs = &in_RDI->time_granted;
        local_7d0 = in_stack_fffffffffffff818.__r;
        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff658,
                   in_stack_fffffffffffff660);
        local_7d8 = TimeRepresentation<count_time<9,_long>_>::operator-
                              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff658
                               ,(TimeRepresentation<count_time<9,_long>_> *)
                                CONCAT17(in_stack_fffffffffffff657,
                                         CONCAT16(in_stack_fffffffffffff656,
                                                  CONCAT24(in_stack_fffffffffffff654,
                                                           in_stack_fffffffffffff650))));
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>(&local_7d8,&in_RDI->rt_lead);
        if (bVar2) {
          in_stack_fffffffffffff800 =
               TimeRepresentation<count_time<9,_long>_>::operator-
                         ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff658,
                          (TimeRepresentation<count_time<9,_long>_> *)
                          CONCAT17(in_stack_fffffffffffff657,
                                   CONCAT16(in_stack_fffffffffffff656,
                                            CONCAT24(in_stack_fffffffffffff654,
                                                     in_stack_fffffffffffff650))));
          in_stack_fffffffffffff808 =
               TimeRepresentation<count_time<9,_long>_>::to_ns
                         ((TimeRepresentation<count_time<9,_long>_> *)
                          CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648));
          in_stack_fffffffffffff810 =
               std::chrono::operator-
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                          CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                          in_stack_fffffffffffff660.__r);
          local_814 = 5;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_810,&local_814)
          ;
          in_stack_fffffffffffff7ff =
               std::chrono::
               operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)pTVar12,
                          (duration<long,_std::ratio<1L,_1000L>_> *)__rhs);
          CLI::std::__cmp_cat::__unspec::__unspec(&local_815,(__unspec *)0x0);
          bVar2 = std::operator>(in_stack_fffffffffffff7ff._M_value);
          if (bVar2) {
            std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
          }
        }
      }
    }
    unlock((FederateState *)
           CONCAT17(in_stack_fffffffffffff657,
                    CONCAT16(in_stack_fffffffffffff656,
                             CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))));
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>(&local_a8,&local_b0);
    bVar3 = false;
    uVar7 = extraout_RDX;
    if (bVar2) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&local_b0,
                         (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffff38);
      bVar3 = false;
      uVar7 = extraout_RDX_00;
      if (bVar2) {
        this_00 = &local_a8;
        local_820 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar3 = TimeRepresentation<count_time<9,_long>_>::operator<(this_00,&local_820);
        uVar7 = extraout_RDX_01;
      }
    }
    if ((bVar3 != false) && ((in_RDI->ignore_time_mismatch_warnings & 1U) == 0)) {
      local_830 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff657,
                                      CONCAT16(in_stack_fffffffffffff656,
                                               CONCAT24(in_stack_fffffffffffff654,
                                                        in_stack_fffffffffffff650))));
      local_870 = "Time mismatch detected: granted time greater than requested time {} vs {}";
      local_868 = 0x49;
      local_878 = TimeRepresentation::operator_cast_to_double
                            ((TimeRepresentation<count_time<9,_long>_> *)0x4e8fdb);
      local_880 = TimeRepresentation::operator_cast_to_double
                            ((TimeRepresentation<count_time<9,_long>_> *)0x4e8ff1);
      local_38 = local_860;
      local_48 = local_870;
      uStack_40 = local_868;
      local_50 = &local_878;
      local_58 = &local_880;
      local_68 = local_870;
      uStack_60 = local_868;
      local_20 = local_878;
      local_18 = local_98;
      local_98[0] = local_878;
      local_28 = local_88;
      local_8 = &local_78;
      local_78 = 0xaa;
      local_10 = local_18;
      local_70 = local_18;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b0);
      local_840 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff657,
                                      CONCAT16(in_stack_fffffffffffff656,
                                               CONCAT24(in_stack_fffffffffffff654,
                                                        in_stack_fffffffffffff650))));
      logMessageSource_01._M_str = (char *)in_stack_fffffffffffff818.__r;
      logMessageSource_01._M_len = in_stack_fffffffffffff810.__r;
      message_01._M_str = (char *)in_stack_fffffffffffff808.__r;
      message_01._M_len = in_stack_fffffffffffff800.internalTimeCode;
      logMessage((FederateState *)
                 CONCAT17(in_stack_fffffffffffff7ff._M_value,in_stack_fffffffffffff7f8),
                 in_stack_fffffffffffff7f4,logMessageSource_01,message_01,
                 (bool)in_stack_fffffffffffff7f3);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff657,
                          CONCAT16(in_stack_fffffffffffff656,
                                   CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))));
      uVar7 = extraout_RDX_02;
    }
    iVar8._8_8_ = uVar7;
    iVar8.grantedTime.internalTimeCode = local_a8.internalTimeCode;
  }
  else {
    bVar2 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_fffffffffffff658,
                       CONCAT13(in_stack_fffffffffffff657,
                                CONCAT12(in_stack_fffffffffffff656,in_stack_fffffffffffff654)));
    if (!bVar2) {
      std::this_thread::yield();
      bVar2 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffff658,
                         CONCAT13(in_stack_fffffffffffff657,
                                  CONCAT12(in_stack_fffffffffffff656,in_stack_fffffffffffff654)));
      if (!bVar2) {
        iVar8 = requestTime((FederateState *)
                            CONCAT17(in_DL,CONCAT16(bVar1,in_stack_ffffffffffffff40)),nextTime_00,
                            (IterationRequest)((ushort)uVar13 >> 8),SUB21(uVar13,0));
        local_a0 = iVar8.state;
        goto LAB_004e938f;
      }
    }
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff657,
                        CONCAT16(in_stack_fffffffffffff656,
                                 CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))));
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff660.__r,
               (char *)in_stack_fffffffffffff658);
    uVar10 = 0;
    logMessageSource_02._M_str = (char *)in_stack_fffffffffffff818.__r;
    logMessageSource_02._M_len = in_stack_fffffffffffff810.__r;
    message_02._M_str = (char *)in_stack_fffffffffffff808.__r;
    message_02._M_len = in_stack_fffffffffffff800.internalTimeCode;
    logMessage((FederateState *)
               CONCAT17(in_stack_fffffffffffff7ff._M_value,in_stack_fffffffffffff7f8),
               in_stack_fffffffffffff7f4,logMessageSource_02,message_02,
               (bool)in_stack_fffffffffffff7f3);
    std::lock_guard<helics::FederateState>::lock_guard
              ((lock_guard<helics::FederateState> *)
               CONCAT17(in_stack_fffffffffffff657,
                        CONCAT16(in_stack_fffffffffffff656,
                                 CONCAT24(in_stack_fffffffffffff654,in_stack_fffffffffffff650))),
               (mutex_type *)CONCAT44(in_stack_fffffffffffff64c,uVar10));
    IVar11 = ITERATING;
    if ((in_RDI->iterating & 1U) == 0) {
      IVar11 = NEXT_STEP;
    }
    FVar4 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x4e9330)
    ;
    if (FVar4 == FINISHED) {
      IVar11 = HALTED;
    }
    else {
      FVar4 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x4e934f);
      if (FVar4 == ERRORED) {
        IVar11 = ERROR_RESULT;
      }
    }
    local_a8.internalTimeCode = (in_RDI->time_granted).internalTimeCode;
    local_a0 = IVar11;
    std::lock_guard<helics::FederateState>::~lock_guard
              ((lock_guard<helics::FederateState> *)0x4e938f);
    iVar8._8_8_ = extraout_RDX_03;
    iVar8.grantedTime.internalTimeCode = local_a8.internalTimeCode;
  }
LAB_004e938f:
  local_a8.internalTimeCode = (baseType)iVar8.grantedTime.internalTimeCode;
  iVar9._9_7_ = iVar8._9_7_;
  iVar9.state = local_a0;
  iVar9.grantedTime.internalTimeCode = local_a8.internalTimeCode;
  return iVar9;
}

Assistant:

iteration_time FederateState::requestTime(Time nextTime, IterationRequest iterate, bool sendRequest)
{
    if (try_lock()) {  // only enter this loop once per federate
        const Time lastTime = timeCoord->getGrantedTime();
        events.clear();  // clear the event queue
        LOG_TRACE(timeCoord->printTimeStatus());
        // timeCoord->timeRequest (nextTime, iterate, nextValueTime (), nextMessageTime ());

        if (sendRequest) {
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = global_id.load();
            treq.actionTime = nextTime;
            setIterationFlags(treq, iterate);
            setActionFlag(treq, indicator_flag);
            addAction(treq);
            LOG_TRACE(timeCoord->printTimeStatus());
        }

// timeCoord->timeRequest (nextTime, iterate, nextValueTime (), nextMessageTime ());
#ifndef HELICS_DISABLE_ASIO
        if ((realtime) && (rt_lag < Time::maxVal())) {
            auto current_clock_time = std::chrono::steady_clock::now();
            auto timegap = current_clock_time - start_clock_time;
            auto current_lead = (nextTime + rt_lag).to_ns() - timegap;
            if (current_lead > std::chrono::milliseconds(0)) {
                ActionMessage tforce(CMD_FORCE_TIME_GRANT);
                tforce.source_id = global_id.load();
                tforce.actionTime = nextTime;
                if (realTimeTimerIndex < 0) {
                    realTimeTimerIndex =
                        mTimer->addTimer(current_clock_time + current_lead, std::move(tforce));
                } else {
                    mTimer->updateTimer(realTimeTimerIndex,
                                        current_clock_time + current_lead,
                                        std::move(tforce));
                }
            } else {
                ActionMessage tforce(CMD_FORCE_TIME_GRANT);
                tforce.source_id = global_id.load();
                tforce.actionTime = nextTime;
                addAction(tforce);
            }
        } else if (grantTimeOutPeriod > timeZero) {
            ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
            grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
            grantCheck.counter = 0;
            if (grantTimeoutTimeIndex < 0) {
                grantTimeoutTimeIndex =
                    mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(), std::move(grantCheck));
            } else {
                mTimer->updateTimerFromNow(realTimeTimerIndex,
                                           grantTimeOutPeriod.to_ms(),
                                           std::move(grantCheck));
            }
        }
#endif
        auto ret = processQueue();
        updateDataForTimeReturn(ret, nextTime, iterate);
        iteration_time retTime = {time_granted, static_cast<IterationResult>(ret)};
#ifndef HELICS_DISABLE_ASIO
        if (realtime) {
            if (rt_lag < Time::maxVal()) {
                mTimer->cancelTimer(realTimeTimerIndex);
            }
            if (ret == MessageProcessingResult::NEXT_STEP) {
                auto current_clock_time = std::chrono::steady_clock::now();
                auto timegap = current_clock_time - start_clock_time;
                if (time_granted - Time(timegap) > rt_lead) {
                    auto current_lead = (time_granted - rt_lead).to_ns() - timegap;
                    if (current_lead > std::chrono::milliseconds(5)) {
                        std::this_thread::sleep_for(current_lead);
                    }
                }
            }
        } else if (grantTimeOutPeriod > timeZero) {
            mTimer->cancelTimer(grantTimeoutTimeIndex);
        }
#endif

        unlock();
        if (retTime.grantedTime > nextTime && nextTime > lastTime &&
            retTime.grantedTime < Time::maxVal()) {
            if (!ignore_time_mismatch_warnings) {
                LOG_WARNING(fmt::format(
                    "Time mismatch detected: granted time greater than requested time {} vs {}",
                    static_cast<double>(retTime.grantedTime),
                    static_cast<double>(nextTime)));
            }
        }
        return retTime;
    }

    // if this is not true then try again the core may have been handling something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return requestTime(nextTime, iterate, sendRequest);
        }
    }
    LOG_WARNING("duplicate locking attempted");
    // this would not be good practice to get into this part of the function
    // but the area must protect itself against the possibility and should return something sensible
    const std::lock_guard<FederateState> fedlock(*this);
    IterationResult ret = iterating ? IterationResult::ITERATING : IterationResult::NEXT_STEP;
    if (state == FederateStates::FINISHED) {
        ret = IterationResult::HALTED;
    } else if (state == FederateStates::ERRORED) {
        ret = IterationResult::ERROR_RESULT;
    }
    return {time_granted, ret};
}